

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<std::filesystem::__cxx11::path>::emplace_back<char_const(&)[2]>
          (SmallVectorBase<std::filesystem::__cxx11::path> *this,char (*args) [2])

{
  SmallVectorBase<std::filesystem::__cxx11::path> *in_RDI;
  char (*in_stack_00000020) [2];
  pointer in_stack_00000028;
  undefined7 in_stack_00000030;
  format in_stack_00000037;
  char (*in_stack_00000038) [2];
  path *in_stack_00000040;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<char_const(&)[2]>
                        ((SmallVectorBase<std::filesystem::__cxx11::path> *)
                         CONCAT17(in_stack_00000037,in_stack_00000030),in_stack_00000028,
                         in_stack_00000020);
  }
  else {
    end(in_RDI);
    std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
              (in_stack_00000040,in_stack_00000038,in_stack_00000037);
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }